

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_forward_dup(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  undefined4 *in_RSI;
  ggml_tensor *in_stack_000000c0;
  ggml_tensor *in_stack_000000c8;
  ggml_compute_params *in_stack_000000d0;
  ggml_tensor *in_stack_00000100;
  ggml_tensor *in_stack_00000108;
  ggml_compute_params *in_stack_00000110;
  
  switch(*in_RSI) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 7:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1165,
            "false");
    abort();
  case 5:
    ggml_compute_forward_dup_f16(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
    break;
  case 6:
    ggml_compute_forward_dup_f32(in_stack_00000110,in_stack_00000108,in_stack_00000100);
  }
  return;
}

Assistant:

static void ggml_compute_forward_dup(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_dup_f16(params, src0, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_dup_f32(params, src0, dst);
            } break;
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}